

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O2

void CMinitialize(CManager_conflict cm)

{
  int iVar1;
  char *pcVar2;
  
  pcVar2 = getenv("CMDefaultTransport");
  if (((pcVar2 != (char *)0x0) ||
      (pcVar2 = CMglobal_default_transport, CMglobal_default_transport != (char *)0x0)) &&
     (CMglobal_default_transport = pcVar2, iVar1 = load_transport(cm,CMglobal_default_transport,0),
     iVar1 == 0)) {
    fwrite("Failed to initialize default transport.  Exiting.\n",0x32,1,_stderr);
    exit(1);
  }
  cm->initialized = cm->initialized + 1;
  return;
}

Assistant:

static void 
CMinitialize(CManager cm)
{
    char **transport_names = CMglobal_alternate_transports;
    char *def = getenv("CMDefaultTransport");
    if (def != NULL) CMglobal_default_transport = def;
    if (CMglobal_default_transport) {
	if (load_transport(cm, CMglobal_default_transport, 0) == 0) {
	    fprintf(stderr, "Failed to initialize default transport.  Exiting.\n");
	    exit(1);
	}
    }
    while ((transport_names != NULL) && (transport_names[0] != NULL)) {
	load_transport(cm, transport_names[0], 1);
	transport_names++;
    }
    cm->initialized++;
}